

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypter.cpp
# Opt level: O0

bool wallet::EncryptSecret
               (CKeyingMaterial *vMasterKey,CKeyingMaterial *vchPlaintext,uint256 *nIV,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *vchCiphertext)

{
  long lVar1;
  span<const_unsigned_char,_18446744073709551615UL> new_iv;
  bool bVar2;
  uchar *puVar3;
  CCrypter *in_RCX;
  CCrypter *in_RDX;
  span<const_unsigned_char,_18446744073709551615UL> *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> chIV;
  CCrypter cKeyCrypter;
  CCrypter *in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  size_type in_stack_ffffffffffffff60;
  span<const_unsigned_char,_18446744073709551615UL> *psVar4;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  byte bVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff90;
  CKeyingMaterial *in_stack_ffffffffffffff98;
  CCrypter *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CCrypter::CCrypter(in_RCX);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffff38);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RCX,
             in_stack_ffffffffffffff60,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffff38);
  puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      in_stack_ffffffffffffff38);
  *(pointer *)puVar3 =
       (in_RDX->vchKey).super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(puVar3 + 8) =
       (in_RDX->vchKey).super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  psVar4 = in_RDI;
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
            (in_RDI,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT17(in_stack_ffffffffffffff47,
                             CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)));
  new_iv._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffff88;
  new_iv._M_ptr = (pointer)psVar4;
  new_iv._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffff8f;
  bVar2 = CCrypter::SetKey(in_RDX,&in_RCX->vchKey,new_iv);
  if (bVar2) {
    bVar5 = CCrypter::Encrypt(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                              in_stack_ffffffffffffff90);
  }
  else {
    bVar5 = false;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
  CCrypter::~CCrypter(in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar5 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool EncryptSecret(const CKeyingMaterial& vMasterKey, const CKeyingMaterial &vchPlaintext, const uint256& nIV, std::vector<unsigned char> &vchCiphertext)
{
    CCrypter cKeyCrypter;
    std::vector<unsigned char> chIV(WALLET_CRYPTO_IV_SIZE);
    memcpy(chIV.data(), &nIV, WALLET_CRYPTO_IV_SIZE);
    if(!cKeyCrypter.SetKey(vMasterKey, chIV))
        return false;
    return cKeyCrypter.Encrypt(vchPlaintext, vchCiphertext);
}